

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_4>,_tcu::Matrix<double,_4,_4>_>::call
          (unary<tcu::Matrix<double,_4,_4>,_tcu::Matrix<double,_4,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  int row_2;
  undefined8 *puVar13;
  GLdouble *data;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 *puVar17;
  uint uVar18;
  Matrix<double,_4,_4> arg;
  Matrix<double,_4,_4> result;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118 [17];
  undefined1 local_90 [128];
  
  puVar13 = &local_198;
  puVar12 = local_118;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  lVar14 = 0;
  lVar15 = 0;
  do {
    lVar16 = 0;
    do {
      uVar18 = 0x3ff00000;
      if (lVar14 != lVar16) {
        uVar18 = 0;
      }
      *(ulong *)((long)puVar12 + lVar16) = (ulong)uVar18 << 0x20;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x80);
    lVar15 = lVar15 + 1;
    puVar12 = puVar12 + 1;
    lVar14 = lVar14 + 0x20;
  } while (lVar15 != 4);
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  lVar14 = 0;
  lVar15 = 0;
  do {
    lVar16 = 0;
    do {
      uVar18 = 0x3ff00000;
      if (lVar14 != lVar16) {
        uVar18 = 0;
      }
      *(ulong *)((long)puVar13 + lVar16) = (ulong)uVar18 << 0x20;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x80);
    lVar15 = lVar15 + 1;
    puVar13 = (undefined8 *)((long)puVar13 + 8);
    lVar14 = lVar14 + 0x20;
  } while (lVar15 != 4);
  lVar14 = 0;
  do {
    puVar1 = (undefined4 *)((long)argument_src + lVar14);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar1 = (undefined4 *)((long)argument_src + lVar14 + 0x10);
    uVar6 = puVar1[1];
    uVar7 = puVar1[2];
    uVar8 = puVar1[3];
    *(undefined4 *)((long)&local_188 + lVar14) = *puVar1;
    *(undefined4 *)((long)&local_188 + lVar14 + 4) = uVar6;
    *(undefined4 *)((long)&uStack_180 + lVar14) = uVar7;
    *(undefined4 *)((long)&uStack_180 + lVar14 + 4) = uVar8;
    *(undefined4 *)((long)&local_198 + lVar14) = uVar2;
    *(undefined4 *)((long)&local_198 + lVar14 + 4) = uVar3;
    *(undefined4 *)((long)&uStack_190 + lVar14) = uVar4;
    *(undefined4 *)((long)&uStack_190 + lVar14 + 4) = uVar5;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x80);
  puVar17 = local_90;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar17,&local_198);
  puVar12 = local_118;
  lVar14 = 0;
  do {
    lVar15 = 0;
    do {
      *(undefined8 *)((long)puVar12 + lVar15) = *(undefined8 *)(puVar17 + lVar15);
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0x80);
    lVar14 = lVar14 + 1;
    puVar12 = puVar12 + 1;
    puVar17 = puVar17 + 8;
  } while (lVar14 != 4);
  lVar14 = 0;
  do {
    uVar9 = *(undefined8 *)((long)local_118 + lVar14);
    uVar10 = *(undefined8 *)((long)local_118 + lVar14 + 8);
    uVar11 = *(undefined8 *)((long)local_118 + lVar14 + 0x18);
    puVar12 = (undefined8 *)((long)result_dst + lVar14 + 0x10);
    *puVar12 = *(undefined8 *)((long)local_118 + lVar14 + 0x10);
    puVar12[1] = uVar11;
    *(undefined8 *)((long)result_dst + lVar14) = uVar9;
    ((undefined8 *)((long)result_dst + lVar14))[1] = uVar10;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x80);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}